

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_gen_edge_face(REF_CELL ref_cell,REF_INT edge,REF_INT *face0,REF_INT *face1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  REF_INT *pRVar8;
  bool bVar9;
  bool bVar10;
  
  *face0 = -1;
  *face1 = -1;
  iVar1 = ref_cell->e2n[edge * 2];
  iVar2 = ref_cell->e2n[edge * 2 + 1];
  lVar5 = 0xc;
  lVar7 = 0;
  do {
    if (ref_cell->face_per <= lVar7) {
      if (*face0 == -1) {
        pcVar6 = "face0 not set";
        uVar4 = 0x55a;
      }
      else {
        if (*face1 != -1) {
          return 0;
        }
        pcVar6 = "face1 not set";
        uVar4 = 0x55b;
      }
LAB_00193e91:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar4,
             "ref_cell_gen_edge_face",pcVar6);
      return 1;
    }
    pRVar8 = ref_cell->f2n;
    iVar3 = *(int *)((long)pRVar8 + lVar5 + -0xc);
    bVar10 = true;
    bVar9 = true;
    if (((iVar1 != iVar3) && (iVar1 != *(int *)((long)pRVar8 + lVar5 + -8))) &&
       (iVar1 != *(int *)((long)pRVar8 + lVar5 + -4))) {
      bVar9 = iVar1 == *(int *)((long)pRVar8 + lVar5);
    }
    if (((iVar2 != iVar3) && (iVar2 != *(int *)((long)pRVar8 + lVar5 + -8))) &&
       (iVar2 != *(int *)((long)pRVar8 + lVar5 + -4))) {
      bVar10 = iVar2 == *(int *)((long)pRVar8 + lVar5);
    }
    if ((bool)(bVar9 & bVar10)) {
      pRVar8 = face0;
      if ((*face0 != -1) && (pRVar8 = face1, *face1 != -1)) {
        pcVar6 = "face1 set twice";
        uVar4 = 0x554;
        goto LAB_00193e91;
      }
      *pRVar8 = (REF_INT)lVar7;
    }
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 0x10;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cell_gen_edge_face(REF_CELL ref_cell, REF_INT edge,
                                          REF_INT *face0, REF_INT *face1) {
  REF_INT face, node0, node1;
  REF_BOOL have_node0;
  REF_BOOL have_node1;

  *face0 = REF_EMPTY;
  *face1 = REF_EMPTY;

  node0 = ref_cell_e2n_gen(ref_cell, 0, edge);
  node1 = ref_cell_e2n_gen(ref_cell, 1, edge);

  for (face = 0; face < ref_cell_face_per(ref_cell); face++) {
    have_node0 = (node0 == ref_cell_f2n_gen(ref_cell, 0, face) ||
                  node0 == ref_cell_f2n_gen(ref_cell, 1, face) ||
                  node0 == ref_cell_f2n_gen(ref_cell, 2, face) ||
                  node0 == ref_cell_f2n_gen(ref_cell, 3, face));
    have_node1 = (node1 == ref_cell_f2n_gen(ref_cell, 0, face) ||
                  node1 == ref_cell_f2n_gen(ref_cell, 1, face) ||
                  node1 == ref_cell_f2n_gen(ref_cell, 2, face) ||
                  node1 == ref_cell_f2n_gen(ref_cell, 3, face));
    if (have_node0 && have_node1) {
      if ((*face0) == REF_EMPTY) {
        (*face0) = face;
      } else {
        RAS(REF_EMPTY == (*face1), "face1 set twice");
        (*face1) = face;
      }
    }
  }

  RAS(REF_EMPTY != (*face0), "face0 not set");
  RAS(REF_EMPTY != (*face1), "face1 not set");

  return REF_SUCCESS;
}